

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::InsertChildPreamble(XMLNode *this,XMLNode *insertThis)

{
  XMLNode *insertThis_local;
  XMLNode *this_local;
  
  if (insertThis->_parent == (XMLNode *)0x0) {
    (*insertThis->_memPool->_vptr_MemPool[5])();
  }
  else {
    Unlink(insertThis->_parent,insertThis);
  }
  return;
}

Assistant:

void XMLNode::InsertChildPreamble( XMLNode* insertThis ) const
{
    TIXMLASSERT( insertThis );
    TIXMLASSERT( insertThis->_document == _document );

    if ( insertThis->_parent )
        insertThis->_parent->Unlink( insertThis );
    else
        insertThis->_memPool->SetTracked();
}